

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O0

uint prvTidytidyErrorCodeFromKey(ctmbstr code)

{
  int iVar1;
  uint local_1c;
  uint i;
  ctmbstr code_local;
  
  local_1c = 0;
  while( true ) {
    if (tidyStringsKeys[local_1c].key == (ctmbstr)0x0) {
      return 0xffffffff;
    }
    iVar1 = strcmp(tidyStringsKeys[local_1c].key,code);
    if (iVar1 == 0) break;
    local_1c = local_1c + 1;
  }
  return tidyStringsKeys[local_1c].value;
}

Assistant:

uint TY_(tidyErrorCodeFromKey)(ctmbstr code)
{
    uint i = 0;
    while (tidyStringsKeys[i].key) {
        if ( strcmp(tidyStringsKeys[i].key, code) == 0 )
            return tidyStringsKeys[i].value;
        i++;
    }
    return UINT_MAX;
}